

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O0

Str * __thiscall Error::Private::Str::operator=(Str *this,Str *other)

{
  char *pcVar1;
  Str *other_local;
  Str *this_local;
  
  if (this->_ptr != (char *)0x0) {
    operator_delete__(this->_ptr);
  }
  this->_len = other->_len;
  pcVar1 = (char *)operator_new__(this->_len + 1);
  this->_ptr = pcVar1;
  memcpy(this->_ptr,other->_ptr,this->_len + 1);
  return this;
}

Assistant:

Str& operator=(const Str& other)
    {
      delete []_ptr;
      _len = other._len;
      _ptr = new char[_len + 1];
      memcpy(_ptr, other._ptr, _len + 1);
      return *this;

    }